

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeSetEtaMinErrFail(void *cvode_mem,realtype eta_min_ef)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetEtaMinErrFail","cvode_mem = NULL illegal.");
  }
  else {
    if ((eta_min_ef <= 0.0) || (1.0 <= eta_min_ef)) {
      *(undefined8 *)((long)cvode_mem + 0x330) = 0x3fb999999999999a;
    }
    else {
      *(realtype *)((long)cvode_mem + 0x330) = eta_min_ef;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetEtaMinErrFail(void* cvode_mem, realtype eta_min_ef)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetEtaMinErrFail",
                   MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* set allowed value or use default */
  if (eta_min_ef <= ZERO || eta_min_ef >= ONE)
    cv_mem->cv_eta_min_ef = ETA_MIN_EF_DEFAULT;
  else
    cv_mem->cv_eta_min_ef = eta_min_ef;

  return(CV_SUCCESS);
}